

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrImpl::getTextValue(DOMAttrImpl *this,DOMNode *node,XMLBuffer *buf)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMChildNode *pDVar2;
  XMLBuffer *buf_local;
  DOMNode *node_local;
  DOMAttrImpl *this_local;
  
  iVar1 = (*node->_vptr_DOMNode[4])();
  if (iVar1 == 3) {
    iVar1 = (*node->_vptr_DOMNode[3])();
    XMLBuffer::append(buf,(XMLCh *)CONCAT44(extraout_var,iVar1));
  }
  else {
    iVar1 = (*node->_vptr_DOMNode[4])();
    if (iVar1 == 5) {
      iVar1 = (*node->_vptr_DOMNode[7])();
      buf_local = (XMLBuffer *)CONCAT44(extraout_var_00,iVar1);
      while (buf_local != (XMLBuffer *)0x0) {
        getTextValue(this,(DOMNode *)buf_local,buf);
        pDVar2 = castToChildImpl((DOMNode *)buf_local);
        buf_local = (XMLBuffer *)pDVar2->nextSibling;
      }
    }
  }
  return;
}

Assistant:

void DOMAttrImpl::getTextValue(DOMNode* node, XMLBuffer& buf) const
{
    if (node->getNodeType() == DOMNode::TEXT_NODE)
        buf.append(node->getNodeValue());
    else if (node->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE)
    {
        for (node = node->getFirstChild(); node != 0; node = castToChildImpl(node)->nextSibling)
        {
            getTextValue(node, buf);
        }
    }

    return;
}